

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O0

wchar_t borg_danger_one_kill
                  (wchar_t y,wchar_t x,wchar_t c,wchar_t i,_Bool average,_Bool full_damage)

{
  ushort uVar1;
  wchar_t x_00;
  wchar_t y_00;
  chunk_conflict *pcVar2;
  monster_race *pmVar3;
  wchar_t wVar4;
  _Bool _Var5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  borg_kill *pbVar10;
  loc_conflict lVar11;
  wchar_t local_108;
  int local_104;
  wchar_t local_b8;
  wchar_t local_b4;
  wchar_t local_b0;
  wchar_t inc_1;
  wchar_t b_q;
  wchar_t inc;
  wchar_t chance;
  wchar_t ii;
  wchar_t e;
  wchar_t t;
  wchar_t monster_speed;
  wchar_t fake_speed;
  wchar_t b_v1;
  wchar_t b_v2;
  wchar_t v2;
  wchar_t v1;
  wchar_t p;
  wchar_t r;
  wchar_t q;
  wchar_t d;
  wchar_t ay;
  wchar_t ax;
  wchar_t x_temp;
  wchar_t y_temp;
  wchar_t y9;
  wchar_t x9;
  monster_race *r_ptr;
  borg_kill *kill;
  _Bool full_damage_local;
  _Bool average_local;
  wchar_t i_local;
  wchar_t c_local;
  wchar_t x_local;
  wchar_t y_local;
  
  pmVar3 = r_info;
  pbVar10 = borg_kills + i;
  uVar1 = pbVar10->r_idx;
  x_00 = (pbVar10->pos).x;
  y_00 = (pbVar10->pos).y;
  t = borg.trait[0x2c];
  e = (wchar_t)pbVar10->speed;
  if (pbVar10->r_idx == 0) {
    x_local = L'\0';
  }
  else if ((int)(uint)pbVar10->r_idx < (int)(z_info->r_max - 1)) {
    if (borg_tp_other_n != 0) {
      for (inc = L'\0'; inc <= borg_tp_other_n; inc = inc + L'\x01') {
        if (i == borg_tp_other_index[inc]) {
          return L'\0';
        }
      }
    }
    if (x < x_00) {
      local_b0 = x_00 - x;
    }
    else {
      local_b0 = x - x_00;
    }
    if (y < y_00) {
      local_b4 = y_00 - y;
    }
    else {
      local_b4 = y - y_00;
    }
    if (local_b0 < local_b4) {
      local_b8 = local_b4;
    }
    else {
      local_b8 = local_b0;
    }
    r = local_b8;
    if (local_b8 < L'\x01') {
      r = L'\x01';
    }
    if (r < L'\x15') {
      if ((0x86 < borg.trait[0x2c]) && (t = L'}', borg_fighting_unique != L'\0')) {
        t = L'x';
      }
      if (borg.temp.fast) {
        t = t + L'\n';
      }
      if (borg_slow_spell) {
        e = e + L'\xfffffff6';
      }
      if ((borg.trait[0x1c] < 0x14) && (borg.trait[0x69] != 0)) {
        e = e + L'\x03';
      }
      p = c * (((("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                  [t] + 99) /
                (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                      [t]) *
               (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                     [e]) / 10);
      if (full_damage) {
        p = ((p + L'\t') / 10) * 10;
      }
      if (p < L'\v') {
        p = L'\n';
      }
      wVar4 = p;
      b_v2 = borg_danger_physical(i,full_damage);
      if ((0x4b0 < borg.time_this_panel) || (25000 < borg_t)) {
        b_v2 = b_v2 / 5;
      }
      _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x14,"r_ptr->flags","RF_NEVER_BLOW");
      if (_Var5) {
        b_v2 = L'\0';
      }
      _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
      if ((_Var5) && (L'\x01' < r)) {
        b_v2 = L'\0';
      }
      _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
      if ((_Var5) && (borg.trait[0x23] < 0x14)) {
        b_v2 = b_v2 + (b_v2 * 0xf) / 10;
      }
      if (((pmVar3[uVar1].friends != (monster_friends *)0x0) ||
          (pmVar3[uVar1].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14))
      {
        if (borg.trait[0x23] < 0xf) {
          iVar6 = b_v2 * 0x12;
        }
        else {
          iVar6 = b_v2 * 0xd;
        }
        b_v2 = b_v2 + iVar6 / 10;
      }
      if ((pbVar10->awake & 1U) == 0) {
        if (0x18 < borg.trait[0x23]) {
          b_v2 = b_v2 / 2;
        }
        b_v2 = b_v2 + (b_v2 * (pmVar3[uVar1].sleep + L'\x05')) / 100;
      }
      if (((((borg_sleep_spell_ii & 1U) != 0) && (r == L'\x01')) &&
          (((pbVar10->awake & 1U) != 0 &&
           ((_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var5
            && (_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var5))
           )))) && ((int)pbVar10->level <= borg.trait[0x23] + -0xf)) {
        if ((borg.trait[0x23] < 0x14) && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) {
          b_v2 = L'\0';
        }
        else {
          b_v2 = b_v2 / 3;
        }
      }
      if (((((borg_sleep_spell & 1U) != 0) && ((pbVar10->awake & 1U) != 0)) &&
          (_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var5))
         && ((_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var5 &&
             ((int)pbVar10->level <= borg.trait[0x23] + -0xf)))) {
        if ((borg.trait[0x23] < 0x14) && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) {
          b_v2 = L'\0';
        }
        else {
          b_v2 = b_v2 / (r + L'\x02');
        }
      }
      if (((borg_crush_spell & 1U) != 0) &&
         (((int)pbVar10->power * (int)pbVar10->injury) / 100 < borg.trait[0x23] * 4)) {
        b_v2 = L'\0';
      }
      if ((pbVar10->confused & 1U) != 0) {
        b_v2 = b_v2 / 2;
      }
      if ((pbVar10->stunned & 1U) != 0) {
        b_v2 = (b_v2 * 10) / 0xd;
      }
      if (((((borg_confuse_spell & 1U) != 0) && ((pbVar10->awake & 1U) != 0)) &&
          ((pbVar10->confused & 1U) == 0)) &&
         (((_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var5
           && (_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var5))
          && ((int)pbVar10->level <= borg.trait[0x23] + -0xf)))) {
        if ((borg.trait[0x23] < 0x14) && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) {
          b_v2 = L'\0';
        }
        else {
          b_v2 = b_v2 / (r + L'\x02');
        }
      }
      if ((borg_fear_mon_spell & 1U) != 0) {
        b_v2 = L'\0';
      }
      if (((L'\n' < p) && (r != L'\x01')) &&
         (_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var5)
         ) {
        monster_speed = L'\0';
        for (inc = L'\0'; pcVar2 = cave, inc < L'\b'; inc = inc + L'\x01') {
          wVar7 = y_00 + ddy_ddd[inc];
          wVar8 = x_00 + ddx_ddd[inc];
          lVar11 = (loc_conflict)loc(wVar8,wVar7);
          _Var5 = square_in_bounds_fully((chunk *)pcVar2,lVar11);
          if (((_Var5) && (borg_grids[wVar7][wVar8].kill == '\0')) &&
             ((borg_grids[wVar7][wVar8].feat != '\x02' && (borg_grids[wVar7][wVar8].feat != '\x16'))
             )) {
            if ((((borg_grids[wVar7][wVar8].feat == '\x15') ||
                 (borg_grids[wVar7][wVar8].feat == '\x11')) ||
                (borg_grids[wVar7][wVar8].feat == '\x12')) ||
               (((borg_grids[wVar7][wVar8].feat == '\x13' ||
                 (borg_grids[wVar7][wVar8].feat == '\x14')) ||
                (borg_grids[wVar7][wVar8].feat == '\x10')))) {
              _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
              if ((_Var5) && (wVar9 = borg_distance(wVar7,wVar8,y,x), wVar9 == L'\x01')) {
                monster_speed = b_v2;
              }
              _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
              if ((_Var5) && (wVar9 = borg_distance(wVar7,wVar8,y,x), wVar9 == L'\x01')) {
                monster_speed = b_v2;
              }
            }
            wVar9 = borg_distance(wVar7,wVar8,y,x);
            if ((wVar9 < L'\x02') && (_Var5 = borg_cave_floor_bold(wVar7,wVar8), _Var5)) {
              monster_speed = b_v2 * (p / (r * 10));
            }
          }
        }
        b_v2 = monster_speed;
      }
      if ((L'\n' < p) && (r == L'\x01')) {
        b_v2 = (b_v2 * p) / 10;
      }
      if ((p == L'\n') && (L'\x01' < r)) {
        b_v2 = L'\0';
      }
      b_v1 = borg_danger_spell(i,y,x,r,average,full_damage);
      if ((pmVar3[uVar1].freq_innate == L'\0') && (pmVar3[uVar1].freq_spell == L'\0')) {
        b_v1 = L'\0';
      }
      wVar7 = borg_distance(y_00,x_00,y,x);
      if ((int)(uint)z_info->max_range < wVar7) {
        b_v1 = L'\0';
      }
      if (((p < L'\v') && (_Var5 = borg_projectable(y_00,x_00,y,x), !_Var5)) &&
         (_Var5 = borg_projectable(y,x,y_00,x_00), !_Var5)) {
        b_v1 = L'\0';
      }
      if (L'\x13' < p) {
        fake_speed = L'\0';
        if (L'\x14' < p) {
          p = L'\x14';
        }
        for (inc = L'\0'; pcVar2 = cave, inc < L'\b'; inc = inc + L'\x01') {
          wVar7 = y_00 + ddy_ddd[inc];
          wVar8 = x_00 + ddx_ddd[inc];
          lVar11 = (loc_conflict)loc(wVar8,wVar7);
          _Var5 = square_in_bounds_fully((chunk *)pcVar2,lVar11);
          if (((_Var5) && (borg_grids[wVar7][wVar8].kill == '\0')) &&
             ((borg_grids[wVar7][wVar8].feat != '\x02' && (borg_grids[wVar7][wVar8].feat != '\x16'))
             )) {
            if (((borg_grids[wVar7][wVar8].feat < 0x15) && (borg_grids[wVar7][wVar8].feat != '\x11')
                ) && ((borg_grids[wVar7][wVar8].feat != '\x12' &&
                      (((borg_grids[wVar7][wVar8].feat != '\x13' &&
                        (borg_grids[wVar7][wVar8].feat != '\x14')) &&
                       (borg_grids[wVar7][wVar8].feat != '\x10')))))) {
              _Var5 = borg_projectable(wVar7,wVar8,y,x);
              if (_Var5) {
                fake_speed = (b_v1 * wVar4) / 10;
              }
            }
            else {
              _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
              if ((_Var5) && (_Var5 = borg_projectable(wVar7,wVar8,y,x), _Var5)) {
                fake_speed = (b_v1 * wVar4) / 10;
              }
              _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
              if ((_Var5) && (_Var5 = borg_projectable(wVar7,wVar8,y,x), _Var5)) {
                fake_speed = (b_v1 * wVar4) / 10;
              }
            }
          }
        }
        b_v1 = fake_speed;
      }
      if ((0x4b0 < borg.time_this_panel) || (25000 < borg_t)) {
        b_v1 = b_v1 / 5;
      }
      _Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
      if ((_Var5) && (borg.trait[0x23] < 0x14)) {
        b_v1 = b_v1 + (b_v1 * 0xc) / 10;
      }
      if (((pmVar3[uVar1].friends != (monster_friends *)0x0) ||
          (pmVar3[uVar1].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14))
      {
        b_v1 = b_v1 + (b_v1 * 0xc) / 10;
      }
      if ((pbVar10->awake & 1U) == 0) {
        if (0x18 < borg.trait[0x23]) {
          b_v1 = b_v1 / 2;
        }
        b_v1 = b_v1 + (b_v1 * (pmVar3[uVar1].sleep + L'\x05')) / 100;
      }
      if ((((borg_sleep_spell_ii & 1U) != 0) && (r == L'\x01')) &&
         (((pbVar10->awake & 1U) != 0 &&
          ((_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var5
           && (_Var5 = flag_has_dbg(pmVar3[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var5)))
          ))) {
        if (borg.trait[0x23] < 0xf) {
          local_104 = borg.trait[0x23];
        }
        else {
          local_104 = ((borg.trait[0x23] + -10) / 4) * 3 + 10;
        }
        if (pbVar10->level <= local_104) {
          b_v1 = b_v1 / 3;
        }
      }
      if (((borg_crush_spell & 1U) != 0) &&
         (((int)pbVar10->power * (int)pbVar10->injury) / 100 < borg.trait[0x23] * 4)) {
        b_v1 = L'\0';
      }
      if ((borg_sleep_spell & 1U) != 0) {
        b_v1 = b_v1 / (r + L'\x02');
      }
      if ((pbVar10->confused & 1U) != 0) {
        b_v1 = b_v1 / 2;
      }
      if ((pbVar10->stunned & 1U) != 0) {
        b_v1 = (b_v1 * 10) / 0xd;
      }
      if ((borg_confuse_spell & 1U) != 0) {
        b_v1 = b_v1 / 6;
      }
      if (!full_damage) {
        iVar6 = (pmVar3[uVar1].freq_innate + pmVar3[uVar1].freq_spell) / 2;
        if (iVar6 < 0xb) {
          b_v1 = (b_v1 << 2) / 10;
        }
        else if (iVar6 < 0x1a) {
          b_v1 = (b_v1 * 6) / 10;
        }
        else if (iVar6 < 0x33) {
          b_v1 = (b_v1 << 3) / 10;
        }
      }
      if (b_v1 != L'\0') {
        b_v1 = (b_v1 * p) / 10;
      }
      if (b_v2 < b_v1) {
        local_108 = b_v1;
      }
      else {
        local_108 = b_v2;
      }
      v2 = local_108;
      if (L'ߐ' < local_108) {
        v2 = L'ߐ';
      }
      x_local = v2;
    }
    else {
      x_local = L'\0';
    }
  }
  else {
    x_local = L'd';
  }
  return x_local;
}

Assistant:

int borg_danger_one_kill(
    int y, int x, int c, int i, bool average, bool full_damage)
{
    borg_kill *kill            = &borg_kills[i];

    struct monster_race *r_ptr = &r_info[kill->r_idx];

    int x9                     = kill->pos.x;
    int y9                     = kill->pos.y;
    int y_temp, x_temp;

    int ax, ay, d;

    int q = 0, r, p, v1 = 0, v2 = 0, b_v2 = 0, b_v1 = 0;

    int fake_speed    = borg.trait[BI_SPEED];
    int monster_speed = kill->speed;
    int t, e;

    int ii;
    int chance;

    /* Paranoia */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 100;

    /* Skip certain monster indexes.
     * These have been listed mainly in Teleport Other
     * checks in borg6.c in the defense maneuvers.
     */
    if (borg_tp_other_n) {
        for (ii = 0; ii <= borg_tp_other_n; ii++) {
            /* Is the current danger check same as a saved monster index? */
            if (i == borg_tp_other_index[ii]) {
                return 0;
            }
        }
    }

    /* Distance components */
    ax = (x9 > x) ? (x9 - x) : (x - x9);
    ay = (y9 > y) ? (y9 - y) : (y - y9);

    /* Distance */
    d = MAX(ax, ay);

    /* Minimal distance */
    if (d < 1)
        d = 1;

    /* Minimal distance */
    if (d > 20)
        return 0;

    /* A very speedy borg will miscalculate danger of some monsters */
    if (borg.trait[BI_SPEED] >= 135)
        fake_speed = (borg_fighting_unique ? 120 : 125);

    /* Consider the character haste and slow monster spells */
    if (borg.temp.fast)
        fake_speed += 10;
    if (borg_slow_spell)
        monster_speed -= 10;

    /* Assume monsters are a little fast when you are low level */
    if (borg.trait[BI_MAXHP] < 20 && borg.trait[BI_CDEPTH])
        monster_speed += 3;

    /* Player energy per game turn  */
    e = extract_energy[(fake_speed)];

    /* Game turns per player move  */
    t = (100 + (e - 1)) / e;

    /*  Monster energy per game turn  */
    e = extract_energy[monster_speed];

    /* Monster moves */
    q = c * ((t * e) / 10);

    /* allow partial hits when not calculating full possible damage */
    if (full_damage)
        q = (int)((q + 9) / 10) * 10;

    /* Minimal energy.  Monsters get at least some energy.
     * If the borg is very fast relative to a monster, then the
     * monster danger is artificially low due to the way the borg
     * will calculate the danger and energy.  So the monsters must
     * be given some base energy to equate the borg's.
     * ie:  the borg with speed +40 (speed = 150) is attacking
     * a monster with normal speed (speed = 110).  One would
     * think that the borg gets 4 attacks per turn over the monster.
     * and this does happen.  What if the monster can deal out
     * 1000 damage pts per monster attack turn?  The borg will
     * reduce the danger to 250 because the borg is 4x faster
     * than the monster.  But eventually the borg will get hit
     * by that 1000 pt damage attack.  And when it does, its
     * going to hurt.
     * So we make sure the monster is at least as fast as us.
     * But the monster is allowed to be faster than us.
     */
    if (q <= 10)
        q = 10;

    /** Danger from physical attacks **/

    /* Physical attacks */
    v1 = borg_danger_physical(i, full_damage);

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v1 = v1 / 5;
    }

    /* No attacks for some monsters */
    if (rf_has(r_ptr->flags, RF_NEVER_BLOW)) {
        v1 = 0;
    }

    /* No movement for some monsters */
    if ((rf_has(r_ptr->flags, RF_NEVER_MOVE)) && (d > 1)) {
        v1 = 0;
    }

    /* multipliers yeild some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY))
        && (borg.trait[BI_CLEVEL] < 20)) { /* extra 50% */
        v1 = v1 + (v1 * 15 / 10);
    }

    /* Friends yeild some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        if (borg.trait[BI_CLEVEL] < 15) {
            /* extra 80% */
            v1 = v1 + (v1 * 18 / 10);
        } else {
            /* extra 30% */
            v1 = v1 + (v1 * 13 / 10);
        }
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* Reduce the fear if Borg is higher level */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v1 = v1 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v1 = v1 + (v1 * inc / 100);
    }
    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {
        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / 3;
            }
        }
    }
    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        if (kill->awake && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v1 = 0;
    }

    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v1 = v1 / 2;
    }
    if (kill->stunned) {
        v1 = v1 * 10 / 13;
    }
    if (borg_confuse_spell) {
        if (kill->awake && !kill->confused
            && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    /* Perceive a reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v1 = 0;
    }

    /* Hack -- Physical attacks require proximity
     *
     * Note that we do try to consider a fast monster moving and attacking
     * in the same round.  We should consider monsters that have a speed 2 or 3
     * classes higher than ours, but most times, the borg will only encounter
     * monsters with a single category higher speed.
     */
    if (q > 10 && d != 1 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))) {
        b_v1 = 0;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat == FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for closeness*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
            }

            /* Is this grid being considered adjacent to the grid for which the
             * borg_danger() was called? */
            if (borg_distance(y_temp, x_temp, y, x) > 1)
                continue;

            /* A legal floor grid */
            if (borg_cave_floor_bold(y_temp, x_temp)) {
                /* Really fast monster can hit me more than once after it's move
                 */
                b_v1 = v1 * (q / (d * 10));
            }
        }

        /* Monster is not able to move and threaten me in the same round */
        v1 = b_v1;
    }

    /* Consider a monster that is fast and can strike more than once per round
     */
    if (q > 10 && d == 1) {
        v1 = v1 * q / 10;
    }

    /* Need to be close if you are normal speed */
    if (q == 10 && d > 1) {
        v1 = 0;
    }

    /** Ranged Attacks **/
    v2 = borg_danger_spell(i, y, x, d, average, full_damage);

    /* Never cast spells */
    if (!r_ptr->freq_innate && !r_ptr->freq_spell) {
        v2 = 0;
    }

    /* Hack -- verify distance */
    if (borg_distance(y9, x9, y, x) > z_info->max_range) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move 1
     * grid. */
    if (q <= 10 && !borg_projectable(y9, x9, y, x)
        && !borg_projectable(y, x, y9, x9)) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move >
     *1 grid. Some fast monsters can take a move action and range attack in the
     *same round. Basically, we see how many grids the monster can move and
     *check LOS from each of those grids to determine the relative danger.  We
     *need to make sure that the monster is not passing through walls unless he
     *has that ability. Consider a fast monster who can move and cast a spell in
     *the same round. This is important for a borg looking for a safe grid from
     *a ranged attacker. If the attacker is fast then he might be able to move
     *to a grid which does have LOS to the grid the borg is considering.
     *
     * ##############
     * #.....#.#.1#D#   Grids marked 2 are threatened by the D currently.
     * #####.#..##@##	Grids marked 1 are safe currently, but the fast D will
     *be able
     * #####.#..1221#	to move to the borg's grid after he moves and the D will
     *be able
     * ##############	to use a ranged attack to grids 1, all in the same
     *round. The borg should not consider grid 1 as safe.
     */
    if (q >= 20) {
        int b_q = q;
        b_v2    = 0;

        /* Maximal speed check */
        if (q > 20)
            q = 20;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat >= FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for LOS*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
            }

            /* Monster on a legal floor grid.  Can he see me? */
            else if (borg_projectable(y_temp, x_temp, y, x))
                b_v2 = v2 * b_q / 10;
        }

        /* Monster is not able to move and threaten me in the same round */
        v2 = b_v2;
    }

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v2 = v2 / 5;
    }

    /* multipliers yield some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY)) && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Friends yield some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* weaklings and should still fear */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v2 = v2 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v2 = v2 + (v2 * inc / 100);
    }

    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {

        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level
                <= ((borg.trait[BI_CLEVEL] < 15)
                        ? borg.trait[BI_CLEVEL]
                        : (((borg.trait[BI_CLEVEL] - 10) / 4) * 3) + 10))) {
            v2 = v2 / 3;
        }
    }

    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v2 = 0;
    }

    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        v2 = v2 / (d + 2);
    }
    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v2 = v2 / 2;
    }
    /* Reduce danger from stunned monsters  */
    if (kill->stunned) {
        v2 = v2 * 10 / 13;
    }
    if (borg_confuse_spell) {
        v2 = v2 / 6;
    }

#if 0 /* They still cast spells, they are still dangerous */
    /* Reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v2 = v2 * 8 / 10;
    }
    if (kill->afraid) {
        v2 = v2 * 8 / 10;
    }
#endif
    if (!full_damage) {
        /* reduce for frequency. */
        chance = (r_ptr->freq_innate + r_ptr->freq_spell) / 2;
        if (chance < 11)
            v2 = ((v2 * 4) / 10);
        else if (chance < 26)
            v2 = ((v2 * 6) / 10);
        else if (chance < 51)
            v2 = ((v2 * 8) / 10);
    }

    /* Danger */
    if (v2) {
        /* Full power */
        r = q;

        /* Total danger */
        v2 = v2 * r / 10;
    }

    /* Maximal danger */
    p = MAX(v1, v2);
    if (p > 2000)
        p = 2000;

    /* Result */
    return (p);
}